

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

void custom_flags_example(void)

{
  unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_> formatter;
  allocator *pattern;
  pattern_formatter *this;
  allocator local_39;
  string local_38 [7];
  char in_stack_ffffffffffffffcf;
  pattern_formatter *in_stack_ffffffffffffffd0;
  
  this = (pattern_formatter *)&stack0xfffffffffffffff8;
  spdlog::details::make_unique<spdlog::pattern_formatter>();
  std::unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>::
  operator->((unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
              *)0x10e48d);
  spdlog::pattern_formatter::add_flag<my_formatter_flag>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
  pattern = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"[%n] [%*] [%^%l%$] %v",pattern);
  spdlog::pattern_formatter::set_pattern(this,(string *)pattern);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>::
  ~unique_ptr((unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
               *)this);
  return;
}

Assistant:

void custom_flags_example() {
    using spdlog::details::make_unique;  // for pre c++14
    auto formatter = make_unique<spdlog::pattern_formatter>();
    formatter->add_flag<my_formatter_flag>('*').set_pattern("[%n] [%*] [%^%l%$] %v");
    // set the new formatter using spdlog::set_formatter(formatter) or
    // logger->set_formatter(formatter) spdlog::set_formatter(std::move(formatter));
}